

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall CTcGenTarg::note_list(CTcGenTarg *this,size_t element_count)

{
  ulong in_RSI;
  long in_RDI;
  
  if (*(ulong *)(in_RDI + 0x10) < in_RSI) {
    if ((0x1999 < in_RSI) && (*(ulong *)(in_RDI + 0x10) < 0x199a)) {
      CTcTokenizer::log_warning(0x3a99);
    }
    *(ulong *)(in_RDI + 0x10) = in_RSI;
  }
  return;
}

Assistant:

void CTcGenTarg::note_list(size_t element_count)
{
    /* if it's the longest list so far, remember it */
    if (element_count > max_list_cnt_)
    {
        /* flag a warning if the stored length would be over 32k */
        if (element_count > ((32*1024 - VMB_LEN) / VMB_DATAHOLDER)
            && max_list_cnt_ <= ((32*1024 - VMB_LEN) / VMB_DATAHOLDER))
            G_tok->log_warning(TCERR_CONST_POOL_OVER_32K);

        /* remember the length */
        max_list_cnt_ = element_count;
    }
}